

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_norm1(Integer g_a,double *nm)

{
  int iVar1;
  int iVar2;
  _iterator_hdl hdl;
  char *ptr;
  char *buf;
  SingleComplex csum;
  DoubleComplex zsum;
  float fval;
  double dval;
  float fsum;
  double dsum;
  long lsum;
  int isum;
  int local_sync_end;
  int local_sync_begin;
  Integer num_blocks_a;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer dims [7];
  Integer ndim;
  Integer nproc;
  Integer j;
  Integer i;
  Integer me;
  Integer type;
  Integer *in_stack_fffffffffffffc08;
  char **in_stack_fffffffffffffc10;
  Integer *in_stack_fffffffffffffc18;
  Integer *in_stack_fffffffffffffc20;
  _iterator_hdl *in_stack_fffffffffffffc28;
  _iterator_hdl *in_stack_fffffffffffffc98;
  Integer in_stack_fffffffffffffca0;
  Integer in_stack_fffffffffffffca8;
  Integer in_stack_fffffffffffffcb0;
  Integer *in_stack_fffffffffffffcb8;
  Integer *in_stack_fffffffffffffcc0;
  void *in_stack_fffffffffffffcc8;
  Integer in_stack_fffffffffffffcd0;
  Integer in_stack_fffffffffffffce0;
  Integer *in_stack_fffffffffffffce8;
  void *in_stack_fffffffffffffcf0;
  Integer in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffdc8;
  Integer in_stack_fffffffffffffdd0;
  Integer *in_stack_fffffffffffffdd8;
  Integer *in_stack_fffffffffffffde0;
  Integer *in_stack_fffffffffffffde8;
  Integer in_stack_fffffffffffffdf0;
  undefined8 local_40;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  pnga_inquire(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8);
  if ((local_40 < 1) || (2 < local_40)) {
    pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pnga_local_iterator_init(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  while (iVar2 = pnga_local_iterator_next
                           (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                            in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                            in_stack_fffffffffffffc08), iVar2 != 0) {
    sgai_norm1_block(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0);
  }
  pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pnga_error(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm1(Integer g_a, double *nm)
{
  Integer type=0;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld; 
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  double dval;
  float fval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;                    /*temporary buffer */
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm1_");

  pnga_inquire (g_a, &type, &ndim, dims);


  if(ndim<=0 || ndim > 2)
    pnga_error("ga_norm1: wrong dimension", ndim);

  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm1_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "+");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "+");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "+");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "+");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "+");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "+");
      break;
    default:
      pnga_error("ga_norm1_: wrong data type ", type);
  }

  /*evaluate the norm1 for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm1_:wrong data type.", type);
  }

  if(local_sync_end)pnga_sync();
}